

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

void __thiscall
t_java_generator::print_const_value
          (t_java_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  int *piVar1;
  size_type sVar2;
  size_t __n;
  t_type *type_00;
  _Alloc_hider _Var3;
  t_java_generator *ptVar4;
  pointer pptVar5;
  pointer pptVar6;
  int iVar7;
  t_type *ptVar8;
  ostream *poVar9;
  ostream *poVar10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  undefined4 extraout_var;
  long *plVar15;
  undefined4 extraout_var_00;
  size_type *psVar16;
  long lVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  _Rb_tree_header *p_Var19;
  char *pcVar20;
  pointer pptVar21;
  bool bVar22;
  string v2;
  string cap_name;
  string val_1;
  vector<t_field_*,_std::allocator<t_field_*>_> fields;
  string local_f0;
  string *local_d0;
  string local_c8;
  t_java_generator *local_a8;
  t_type *local_a0;
  ostream *local_98;
  string local_90;
  _Rb_tree_node_base *local_70;
  vector<t_field_*,_std::allocator<t_field_*>_> local_68;
  string local_50;
  
  local_d0 = name;
  ptVar8 = t_type::get_true_type(type);
  local_98 = out;
  t_generator::indent((t_generator *)this,out);
  poVar9 = local_98;
  if (!defval) {
    pcVar20 = "public static final ";
    if (in_static) {
      pcVar20 = "";
    }
    lVar17 = 0x14;
    if (in_static) {
      lVar17 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_98,pcVar20,lVar17);
    type_name_abi_cxx11_(&local_f0,this,ptVar8,false,false,false,false);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
  poVar9 = local_98;
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[10])(ptVar8);
    poVar9 = local_98;
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xb])(ptVar8);
      local_a8 = this;
      if (((char)iVar7 != '\0') ||
         (iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8), (char)iVar7 != '\0')) {
        local_a0 = ptVar8;
        std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
                  (&local_68,(vector<t_field_*,_std::allocator<t_field_*>_> *)(ptVar8 + 1));
        pptVar6 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pptVar5 = local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar11 = (long)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar17 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<t_field::key_compare>>
                    (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<t_field**,std::vector<t_field*,std::allocator<t_field*>>>,__gnu_cxx::__ops::_Iter_comp_iter<t_field::key_compare>>
                    (pptVar5,pptVar6);
        }
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
        type_name_abi_cxx11_(&local_f0,this,local_a0,false,true,false,false);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (!in_static) {
          poVar10 = t_generator::indent((t_generator *)this,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        p_Var12 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_70 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        if (p_Var12 != local_70) {
          do {
            if (local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
LAB_00246801:
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar7 = (*(local_a0->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_c8,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar7));
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_c8);
              local_f0._M_dataplus._M_p = (pointer)*plVar15;
              psVar16 = (size_type *)(plVar15 + 2);
              if ((size_type *)local_f0._M_dataplus._M_p == psVar16) {
                local_f0.field_2._M_allocated_capacity = *psVar16;
                local_f0.field_2._8_4_ = (undefined4)plVar15[3];
                local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar15 + 0x1c);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              }
              else {
                local_f0.field_2._M_allocated_capacity = *psVar16;
              }
              local_f0._M_string_length = plVar15[1];
              *plVar15 = (long)psVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              lVar17 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,lVar17,
                         *(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar17);
              std::operator+(pbVar14,&local_f0,&local_90);
              __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar8 = (t_type *)0x0;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
            do {
              sVar2 = paVar18->_M_allocated_capacity;
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              lVar17 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,lVar17,
                         *(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar17);
              _Var3._M_p = local_f0._M_dataplus._M_p;
              __n = *(size_t *)(sVar2 + 0x70);
              if (__n == local_f0._M_string_length) {
                if (__n == 0) {
                  bVar22 = true;
                }
                else {
                  iVar7 = bcmp(*(void **)(sVar2 + 0x68),local_f0._M_dataplus._M_p,__n);
                  bVar22 = iVar7 == 0;
                }
              }
              else {
                bVar22 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p != &local_f0.field_2) {
                operator_delete(_Var3._M_p);
              }
              poVar9 = local_98;
              ptVar4 = local_a8;
              if (bVar22) {
                ptVar8 = *(t_type **)(paVar18->_M_allocated_capacity + 0x60);
              }
              paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&paVar18->_M_allocated_capacity + 1);
            } while (paVar18 !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            if (ptVar8 == (t_type *)0x0) goto LAB_00246801;
            render_const_value_abi_cxx11_
                      (&local_f0,local_a8,local_98,ptVar8,(t_const_value *)p_Var12[1]._M_parent);
            poVar10 = t_generator::indent((t_generator *)ptVar4,poVar9);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            lVar17 = *(long *)(*(long *)(p_Var12 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,lVar17,*(long *)(*(long *)(p_Var12 + 1) + 0x50) + lVar17)
            ;
            get_cap_name(&local_c8,local_a8,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"set",3);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9,local_c8._M_dataplus._M_p,local_c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          } while (p_Var12 != local_70);
        }
        if (!in_static) {
          piVar1 = &(local_a8->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar10 = t_generator::indent((t_generator *)local_a8,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          return;
        }
        goto LAB_00245d99;
      }
      iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[0x10])(ptVar8);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xe])(ptVar8);
        if (((char)iVar7 == '\0') &&
           (iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xf])(ptVar8), (char)iVar7 == '\0')) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x20);
          iVar7 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])(ptVar8);
          std::operator+(pbVar14,"compiler error: no const of type ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_00,iVar7));
          __cxa_throw(pbVar14,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        bVar22 = is_enum_set(this,ptVar8);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
        if (bVar22) {
          local_a0 = ptVar8;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          type_name_abi_cxx11_(&local_f0,this,ptVar8,false,true,true,false);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".noneOf(",8);
          inner_enum_type_name_abi_cxx11_(&local_c8,this,local_a0);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_c8._M_dataplus._M_p,local_c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
        }
        else {
          local_a0 = ptVar8;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
          type_name_abi_cxx11_(&local_f0,this,ptVar8,false,true,false,false);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (!in_static) {
          poVar10 = t_generator::indent((t_generator *)this,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        ptVar8 = local_a0;
        (*(local_a0->super_t_doc)._vptr_t_doc[0xe])(local_a0);
        pptVar21 = (value->listVal_).
                   super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (pptVar21 !=
            (value->listVal_).super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ptVar8 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
          do {
            ptVar4 = local_a8;
            render_const_value_abi_cxx11_(&local_f0,local_a8,poVar9,ptVar8,*pptVar21);
            poVar10 = t_generator::indent((t_generator *)ptVar4,poVar9);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,".add(",5);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            pptVar21 = pptVar21 + 1;
          } while (pptVar21 !=
                   (value->listVal_).
                   super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if (!in_static) {
          piVar1 = &(local_a8->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar10 = t_generator::indent((t_generator *)local_a8,poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        return;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_allocated_capacity =
           local_f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar22 = is_enum_map(this,ptVar8);
      if (bVar22) {
        inner_enum_type_name_abi_cxx11_(&local_c8,this,ptVar8);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new ",7);
      type_name_abi_cxx11_(&local_c8,this,ptVar8,false,true,false,false);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_c8._M_dataplus._M_p,local_c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (!in_static) {
        poVar10 = t_generator::indent((t_generator *)this,poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"static {",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
      }
      p_Var13 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var19 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var13 != p_Var19) {
        type_00 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
        ptVar8 = *(t_type **)&ptVar8[1].annotations_._M_t._M_impl;
        do {
          ptVar4 = local_a8;
          render_const_value_abi_cxx11_
                    (&local_c8,local_a8,poVar9,type_00,*(t_const_value **)(p_Var13 + 1));
          render_const_value_abi_cxx11_
                    (&local_90,ptVar4,poVar9,ptVar8,(t_const_value *)p_Var13[1]._M_parent);
          poVar10 = t_generator::indent((t_generator *)ptVar4,poVar9);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".put(",5);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_c8._M_dataplus._M_p,local_c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_90._M_dataplus._M_p,local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != p_Var19);
      }
      if (!in_static) {
        piVar1 = &(local_a8->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar10 = t_generator::indent((t_generator *)local_a8,poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    else {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_98,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
      render_const_value_abi_cxx11_(&local_f0,this,poVar9,ptVar8,value);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
  }
  else {
    render_const_value_abi_cxx11_(&local_f0,this,local_98,ptVar8,value);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(local_d0->_M_dataplus)._M_p,local_d0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)local_f0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
    return;
  }
LAB_00245d99:
  operator_delete(local_68.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return;
}

Assistant:

void t_java_generator::print_const_value(std::ostream& out,
                                         string name,
                                         t_type* type,
                                         t_const_value* value,
                                         bool in_static,
                                         bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "" : "public static final ") << type_name(type) << " ";
  }
  if (type->is_base_type()) {
    string v2 = render_const_value(out, type, value);
    out << name << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    out << name << " = " << render_const_value(out, type, value) << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& unsorted_fields = ((t_struct*)type)->get_members();
    vector<t_field*> fields = unsorted_fields;
    std::sort(fields.begin(), fields.end(), t_field::key_compare());
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << name << " = new " << type_name(type, false, true) << "();" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, field_type, v_iter->second);
      indent(out) << name << ".";
      std::string cap_name = get_cap_name(v_iter->first->get_string());
      out << "set" << cap_name << "(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_map()) {
    std::string constructor_args;
    if (is_enum_map(type)) {
      constructor_args = inner_enum_type_name(type);
    }
    out << name << " = new " << type_name(type, false, true) << "(" << constructor_args << ");" << endl;
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, ktype, v_iter->first);
      string val = render_const_value(out, vtype, v_iter->second);
      indent(out) << name << ".put(" << key << ", " << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (is_enum_set(type)) {
      out << name << " = " << type_name(type, false, true, true) << ".noneOf(" << inner_enum_type_name(type) << ");" << endl;
    } else {
      out << name << " = new " << type_name(type, false, true) << "();" << endl;
    }
    if (!in_static) {
      indent(out) << "static {" << endl;
      indent_up();
    }
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, etype, *v_iter);
      indent(out) << name << ".add(" << val << ");" << endl;
    }
    if (!in_static) {
      indent_down();
      indent(out) << "}" << endl;
    }
    out << endl;
  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}